

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_extra_drop_info.cpp
# Opt level: O2

unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>,_true> __thiscall
duckdb::ExtraDropSecretInfo::Deserialize(ExtraDropSecretInfo *this,Deserializer *deserializer)

{
  ExtraDropSecretInfo *this_00;
  pointer pEVar1;
  _Head_base<0UL,_duckdb::ExtraDropSecretInfo_*,_false> local_20;
  
  this_00 = (ExtraDropSecretInfo *)operator_new(0x30);
  ExtraDropSecretInfo(this_00);
  local_20._M_head_impl = this_00;
  pEVar1 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                         *)&local_20);
  Deserializer::ReadProperty<duckdb::SecretPersistType>
            (deserializer,200,"persist_mode",&(pEVar1->super_ExtraDropInfo).field_0x9);
  pEVar1 = unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
           ::operator->((unique_ptr<duckdb::ExtraDropSecretInfo,_std::default_delete<duckdb::ExtraDropSecretInfo>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xc9,"secret_storage",&pEVar1->secret_storage);
  (this->super_ExtraDropInfo)._vptr_ExtraDropInfo = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>)
         (unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>_>)this;
}

Assistant:

unique_ptr<ExtraDropInfo> ExtraDropSecretInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ExtraDropSecretInfo>(new ExtraDropSecretInfo());
	deserializer.ReadProperty<SecretPersistType>(200, "persist_mode", result->persist_mode);
	deserializer.ReadPropertyWithDefault<string>(201, "secret_storage", result->secret_storage);
	return std::move(result);
}